

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase123::run(TestCase123 *this)

{
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<capnp::word> firstSegment;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  Reader value;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Fault f_1;
  TestInitMessageBuilder builder2;
  SegmentInit init;
  MallocMessageBuilder builder;
  word buffer [2048];
  Builder local_42f0;
  StructBuilder local_42d8;
  PointerBuilder local_42a8;
  word *local_4290;
  WirePointer local_4288;
  word *local_4280;
  word *local_4270;
  StructBuilder local_4268;
  StructBuilder local_4240;
  PointerBuilder local_4218;
  StructBuilder in_stack_ffffffffffffbe00;
  SegmentInit local_4130;
  MallocMessageBuilder local_4118;
  word local_4028 [69];
  StructBuilder in_stack_ffffffffffffc200;
  
  memset(local_4028,0,0x4000);
  firstSegment.size_ = 0x800;
  firstSegment.ptr = local_4028;
  MallocMessageBuilder::MallocMessageBuilder(&local_4118,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_42d8,&local_4118.super_MessageBuilder);
  local_4218.pointer = (WirePointer *)local_42d8.data;
  local_4218.segment = local_42d8.segment;
  local_4218.capTable = local_42d8.capTable;
  PointerBuilder::getStruct(&local_4240,&local_4218,(StructSize)0x140006,(word *)0x0);
  initTestMessage((Builder)in_stack_ffffffffffffbe00);
  AVar3 = MessageBuilder::getSegmentsForOutput(&local_4118.super_MessageBuilder);
  local_42d8.segment = (SegmentBuilder *)AVar3.size_;
  pAVar2 = AVar3.ptr;
  if (local_42d8.segment != (SegmentBuilder *)0x1) {
    local_42a8.segment = (SegmentBuilder *)CONCAT44(local_42a8.segment._4_4_,1);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              ((Fault *)&local_4218,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x83,FAILED,"(1) == (segs.size())","1, segs.size()",(int *)&local_42a8,
               (unsigned_long *)&local_42d8);
    kj::_::Debug::Fault::fatal((Fault *)&local_4218);
  }
  if (pAVar2->ptr != local_4028) {
    local_42d8.segment = (SegmentBuilder *)0x0;
    local_4218.segment = (SegmentBuilder *)0x0;
    local_4218.capTable = (CapTableBuilder *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_42d8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_42d8);
  }
  local_4130.space.size_ = 0x800;
  local_4130.wordsUsed = pAVar2->size_;
  segments.size_ = 1;
  segments.ptr = &local_4130;
  local_4130.space.ptr = local_4028;
  MessageBuilder::MessageBuilder((MessageBuilder *)&local_4218,segments);
  local_4218.segment = (SegmentBuilder *)&PTR__TestInitMessageBuilder_0036b2a0;
  MessageBuilder::getRootInternal((Builder *)&local_42a8,(MessageBuilder *)&local_4218);
  local_42d8.data = local_42a8.pointer;
  local_42d8.segment = local_42a8.segment;
  local_42d8.capTable = local_42a8.capTable;
  PointerBuilder::getStruct
            (&local_4268,(PointerBuilder *)&local_42d8,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_ffffffffffffc200);
  MessageBuilder::getRootInternal(&local_42f0,(MessageBuilder *)&local_4218);
  local_42a8.pointer = local_42f0.builder.pointer;
  local_42a8.segment = local_42f0.builder.segment;
  local_42a8.capTable = local_42f0.builder.capTable;
  PointerBuilder::getStruct(&local_42d8,&local_42a8,(StructSize)0x140006,(word *)0x0);
  ((WirePointer *)((long)local_42d8.data + 8))->offsetAndKind = 0x1e1b9;
  ((WirePointer *)((long)local_42d8.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  MessageBuilder::getRootInternal(&local_42f0,&local_4118.super_MessageBuilder);
  local_42a8.pointer = local_42f0.builder.pointer;
  local_42a8.segment = local_42f0.builder.segment;
  local_42a8.capTable = local_42f0.builder.capTable;
  PointerBuilder::getStruct(&local_42d8,&local_42a8,(StructSize)0x140006,(word *)0x0);
  if (*(WirePointer *)((long)local_42d8.data + 8) != (WirePointer)0x1e1b9 &&
      kj::_::Debug::minSeverity < 3) {
    local_4290 = (word *)CONCAT44(local_4290._4_4_,0x1e1b9);
    MessageBuilder::getRootInternal(&local_42f0,&local_4118.super_MessageBuilder);
    local_42a8.pointer = local_42f0.builder.pointer;
    local_42a8.segment = local_42f0.builder.segment;
    local_42a8.capTable = local_42f0.builder.capTable;
    PointerBuilder::getStruct(&local_42d8,&local_42a8,(StructSize)0x140006,(word *)0x0);
    local_4288 = *(WirePointer *)((long)local_42d8.data + 8);
    kj::_::Debug::log<char_const(&)[79],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x8e,ERROR,
               "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
               ,(char (*) [79])
                "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
               (int *)&local_4290,(long *)&local_4288);
  }
  MessageBuilder::getRootInternal(&local_42f0,(MessageBuilder *)&local_4218);
  local_42a8.pointer = local_42f0.builder.pointer;
  local_42a8.segment = local_42f0.builder.segment;
  local_42a8.capTable = local_42f0.builder.capTable;
  PointerBuilder::getStruct(&local_42d8,&local_42a8,(StructSize)0x140006,(word *)0x0);
  local_42a8.segment = local_42d8.segment;
  local_42a8.capTable = local_42d8.capTable;
  local_42a8.pointer = local_42d8.pointers;
  value.super_StringPtr.content.size_ = 10;
  value.super_StringPtr.content.ptr = "foobarbaz";
  PointerBuilder::setBlob<capnp::Text>(&local_42a8,value);
  sVar1 = pAVar2->size_;
  MessageBuilder::getRootInternal(&local_42f0,(MessageBuilder *)&local_4218);
  local_42a8.pointer = local_42f0.builder.pointer;
  local_42a8.segment = local_42f0.builder.segment;
  local_42a8.capTable = local_42f0.builder.capTable;
  PointerBuilder::getStruct(&local_42d8,&local_42a8,(StructSize)0x140006,(word *)0x0);
  local_42a8.segment = local_42d8.segment;
  local_42a8.capTable = local_42d8.capTable;
  local_42a8.pointer = local_42d8.pointers;
  PointerBuilder::getBlob<capnp::Text>((Builder *)&local_4288,&local_42a8,(void *)0x0,0);
  if ((local_4028 + sVar1 != local_4280) && (kj::_::Debug::minSeverity < 3)) {
    local_4290 = local_4028 + pAVar2->size_;
    MessageBuilder::getRootInternal(&local_42f0,(MessageBuilder *)&local_4218);
    local_42a8.pointer = local_42f0.builder.pointer;
    local_42a8.segment = local_42f0.builder.segment;
    local_42a8.capTable = local_42f0.builder.capTable;
    PointerBuilder::getStruct(&local_42d8,&local_42a8,(StructSize)0x140006,(word *)0x0);
    local_42a8.segment = local_42d8.segment;
    local_42a8.capTable = local_42d8.capTable;
    local_42a8.pointer = local_42d8.pointers;
    PointerBuilder::getBlob<capnp::Text>((Builder *)&local_4288,&local_42a8,(void *)0x0,0);
    local_4270 = local_4280;
    kj::_::Debug::log<char_const(&)[154],void*,void*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x97,ERROR,
               "\"failed: expected \" \"(kj::implicitCast<void*>(buffer + segs[0].size())) == (kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()))\", kj::implicitCast<void*>(buffer + segs[0].size()), kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin())"
               ,(char (*) [154])
                "failed: expected (kj::implicitCast<void*>(buffer + segs[0].size())) == (kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()))"
               ,&local_4290,&local_4270);
  }
  local_4218.segment = (SegmentBuilder *)&PTR__TestInitMessageBuilder_0036b2a0;
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)&local_4218);
  MallocMessageBuilder::~MallocMessageBuilder(&local_4118);
  return;
}

Assistant:

TEST(Message, MessageBuilderInitSpaceAvailable) {
  word buffer[2048];
  memset(buffer, 0, sizeof(buffer));
  MallocMessageBuilder builder(buffer);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Find out how much space in `buffer` was used in order to use in initializing the new message.
  auto segs = builder.getSegmentsForOutput();
  ASSERT_EQ(1, segs.size());
  KJ_ASSERT(segs[0].begin() == buffer);

  MessageBuilder::SegmentInit init = { kj::ArrayPtr<word>(buffer), segs[0].size() };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(kj::arrayPtr(&init, 1));
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Ask builder2 to allocate new space. It should go into the free space at the end of the
  // segment.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(0, builder2.allocations.size());

  EXPECT_EQ(kj::implicitCast<void*>(buffer + segs[0].size()),
            kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()));
}